

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

Conjuncts *
CheckInTables(DdNode *node,DdNode *g1,DdNode *h1,DdNode *g2,DdNode *h2,st__table *ghTable,
             st__table *cacheTable,int *outOfMem)

{
  int iVar1;
  int iVar2;
  int value;
  Conjuncts *factors;
  int pairValue2;
  int pairValue1;
  st__table *ghTable_local;
  DdNode *h2_local;
  DdNode *g2_local;
  DdNode *h1_local;
  DdNode *g1_local;
  DdNode *node_local;
  
  *outOfMem = 0;
  iVar1 = PairInTables(g1,h1,ghTable);
  iVar2 = PairInTables(g2,h2,ghTable);
  if ((iVar1 == 0) && (iVar2 == 0)) {
    node_local = (DdNode *)0x0;
  }
  else {
    node_local = (DdNode *)malloc(0x10);
    if (node_local == (DdNode *)0x0) {
      *outOfMem = 1;
      node_local = (DdNode *)0x0;
    }
    else {
      if (iVar1 == 1) {
        *(DdNode **)node_local = g1;
        node_local->next = h1;
      }
      else if (iVar2 == 1) {
        *(DdNode **)node_local = g2;
        node_local->next = h2;
      }
      else if (iVar1 == 2) {
        *(DdNode **)node_local = h1;
        node_local->next = g1;
      }
      else if (iVar2 == 2) {
        *(DdNode **)node_local = h2;
        node_local->next = g2;
      }
      else if (iVar1 == 3) {
        *(DdNode **)node_local = g1;
        node_local->next = h1;
        if ((h1 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)h1 & 0xfffffffffffffffe),(char *)0x2),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar1 == 7) {
        *(DdNode **)node_local = g1;
        node_local->next = h1;
        if ((h1 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)h1 & 0xfffffffffffffffe),(char *)0x3),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar1 == 5) {
        *(DdNode **)node_local = g1;
        node_local->next = h1;
        if ((g1 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)g1 & 0xfffffffffffffffe),(char *)0x1),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar1 == 8) {
        *(DdNode **)node_local = g1;
        node_local->next = h1;
        if ((g1 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)g1 & 0xfffffffffffffffe),(char *)0x3),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar2 == 3) {
        *(DdNode **)node_local = g2;
        node_local->next = h2;
        if ((h2 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)h2 & 0xfffffffffffffffe),(char *)0x2),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar2 == 7) {
        *(DdNode **)node_local = g2;
        node_local->next = h2;
        if ((h2 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)h2 & 0xfffffffffffffffe),(char *)0x3),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar2 == 5) {
        *(DdNode **)node_local = g2;
        node_local->next = h2;
        if ((g2 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)g2 & 0xfffffffffffffffe),(char *)0x1),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar2 == 8) {
        *(DdNode **)node_local = g2;
        node_local->next = h2;
        if ((g2 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)g2 & 0xfffffffffffffffe),(char *)0x3),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar1 == 4) {
        *(DdNode **)node_local = h1;
        node_local->next = g1;
        if ((h1 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)h1 & 0xfffffffffffffffe),(char *)0x1),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar1 == 6) {
        *(DdNode **)node_local = h1;
        node_local->next = g1;
        if ((g1 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)g1 & 0xfffffffffffffffe),(char *)0x2),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar2 == 4) {
        *(DdNode **)node_local = h2;
        node_local->next = g2;
        if ((h2 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)h2 & 0xfffffffffffffffe),(char *)0x1),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      else if (iVar2 == 6) {
        *(DdNode **)node_local = h2;
        node_local->next = g2;
        if ((g2 != one) &&
           (iVar1 = st__insert(ghTable,(char *)((ulong)g2 & 0xfffffffffffffffe),(char *)0x2),
           iVar1 == -10000)) {
          *outOfMem = 1;
          if (node_local != (DdNode *)0x0) {
            free(node_local);
          }
          return (Conjuncts *)0x0;
        }
      }
      iVar1 = st__insert(cacheTable,(char *)node,(char *)node_local);
      if (iVar1 == -10000) {
        *outOfMem = 1;
        if (node_local != (DdNode *)0x0) {
          free(node_local);
        }
        node_local = (DdNode *)0x0;
      }
    }
  }
  return (Conjuncts *)node_local;
}

Assistant:

static Conjuncts *
CheckInTables(
  DdNode * node,
  DdNode * g1,
  DdNode * h1,
  DdNode * g2,
  DdNode * h2,
  st__table * ghTable,
  st__table * cacheTable,
  int * outOfMem)
{
    int pairValue1,  pairValue2;
    Conjuncts *factors;
    int value;
    
    *outOfMem = 0;

    /* check existence of pair in table */
    pairValue1 = PairInTables(g1, h1, ghTable);
    pairValue2 = PairInTables(g2, h2, ghTable);

    /* if none of the 4 exist in the gh tables, return NULL */
    if ((pairValue1 == NONE) && (pairValue2 == NONE)) {
        return NULL;
    }
    
    factors = ABC_ALLOC(Conjuncts, 1);
    if (factors == NULL) {
        *outOfMem = 1;
        return NULL;
    }

    /* pairs that already exist in the table get preference. */
    if (pairValue1 == PAIR_ST) {
        factors->g = g1;
        factors->h = h1;
    } else if (pairValue2 == PAIR_ST) {
        factors->g = g2;
        factors->h = h2;
    } else if (pairValue1 == PAIR_CR) {
        factors->g = h1;
        factors->h = g1;
    } else if (pairValue2 == PAIR_CR) {
        factors->g = h2;
        factors->h = g2;
    } else if (pairValue1 == G_ST) {
        /* g exists in the table, h is not found in either table */
        factors->g = g1;
        factors->h = h1;
        if (h1 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == BOTH_G) {
        /* g and h are  found in the g table */
        factors->g = g1;
        factors->h = h1;
        if (h1 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == H_ST) {
        /* h exists in the table, g is not found in either table */
        factors->g = g1;
        factors->h = h1;
        if (g1 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == BOTH_H) {
        /* g and h are  found in the h table */
        factors->g = g1;
        factors->h = h1;
        if (g1 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == G_ST) {
        /* g exists in the table, h is not found in either table */
        factors->g = g2;
        factors->h = h2;
        if (h2 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if  (pairValue2 == BOTH_G) {
        /* g and h are  found in the g table */
        factors->g = g2;
        factors->h = h2;
        if (h2 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == H_ST) { 
        /* h exists in the table, g is not found in either table */
        factors->g = g2;
        factors->h = h2;
        if (g2 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == BOTH_H) {
        /* g and h are  found in the h table */
        factors->g = g2;
        factors->h = h2;
        if (g2 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == G_CR) {
        /* g found in h table and h in none */
        factors->g = h1;
        factors->h = g1;
        if (h1 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == H_CR) {
        /* h found in g table and g in none */
        factors->g = h1;
        factors->h = g1;
        if (g1 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == G_CR) {
        /* g found in h table and h in none */
        factors->g = h2;
        factors->h = g2;
        if (h2 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == H_CR) {
        /* h found in g table and g in none */
        factors->g = h2;
        factors->h = g2;
        if (g2 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    }
    
    /* Store factors in cache table for later use. */
    if ( st__insert(cacheTable, (char *)node, (char *)factors) ==
            st__OUT_OF_MEM) {
        *outOfMem = 1;
        ABC_FREE(factors);
        return(NULL);
    }
    return factors;
}